

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* add_matrix<double>(vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *__return_storage_ptr__,
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *a,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       *b)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  allocator_type local_4a;
  allocator_type local_49;
  vector<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (a->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar12 = ((long)(a->
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
           -0x5555555555555555;
  uVar8 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data) >> 3;
  iVar7 = (int)uVar8;
  std::vector<double,_std::allocator<double>_>::vector(&local_48,(long)iVar7,&local_49);
  iVar11 = (int)uVar12;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar11,&local_48,&local_4a);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (0 < iVar11) {
    pvVar1 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (b->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    do {
      if (0 < iVar7) {
        lVar4 = *(long *)&pvVar1[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar5 = *(long *)&pvVar2[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        lVar6 = *(long *)&pvVar3[uVar9].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data;
        uVar10 = 0;
        do {
          *(double *)(lVar6 + uVar10 * 8) =
               *(double *)(lVar4 + uVar10 * 8) + *(double *)(lVar5 + uVar10 * 8);
          uVar10 = uVar10 + 1;
        } while ((uVar8 & 0x7fffffff) != uVar10);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != (uVar12 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > add_matrix(const std::vector<std::vector<T> >& a, const std::vector<std::vector<T> >& b){
    int n = a.size();
    int m = a[0].size();
    std::vector<std::vector<T> > ans(n, std::vector<T>(m));
    for (int i = 0; i < n; ++i)
        for (int j = 0; j < m; ++j)
            ans[i][j] = a[i][j] + b[i][j];
    return ans;
}